

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O3

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Callback *cb)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Fl_Menu_Item *this_00;
  long lVar4;
  
  this_00 = this->menu_;
  lVar4 = 0x10;
  lVar3 = 0;
  while( true ) {
    if (this_00 == (Fl_Menu_Item *)0x0) {
      lVar2 = 0;
    }
    else {
      iVar1 = Fl_Menu_Item::size(this_00);
      lVar2 = (long)iVar1;
    }
    if (lVar2 <= lVar3) break;
    this_00 = this->menu_;
    if (*(Fl_Callback **)((long)&this_00->text + lVar4) == cb) goto LAB_001bffa5;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x38;
  }
  lVar3 = 0xffffffff;
LAB_001bffa5:
  return (int)lVar3;
}

Assistant:

int Fl_Menu_::find_index(Fl_Callback *cb) const {
  for ( int t=0; t < size(); t++ )
    if (menu_[t].callback_==cb)
      return(t);
  return(-1);
}